

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# todec.h
# Opt level: O3

void cppcms::impl::details::decimal_traits<true>::conv<short>(short v,char **begin,char **buf)

{
  char *pcVar1;
  uint uVar2;
  short sVar3;
  uint uVar4;
  
  pcVar1 = *buf;
  if (v < 0) {
    *buf = pcVar1 + 1;
    *pcVar1 = '-';
    *begin = *buf;
    uVar4 = (uint)(ushort)v;
    do {
      sVar3 = (short)uVar4;
      uVar2 = (int)sVar3 / 10;
      pcVar1 = *buf;
      *buf = pcVar1 + 1;
      *pcVar1 = '0' - ((char)uVar4 + (char)uVar2 * -10);
      uVar4 = uVar2;
    } while (0x12 < (ushort)(sVar3 + 9U));
  }
  else {
    *begin = pcVar1;
    uVar4 = (uint)(ushort)v;
    if (v != 0) {
      do {
        sVar3 = (short)uVar4;
        uVar2 = (int)sVar3 / 10;
        pcVar1 = *buf;
        *buf = pcVar1 + 1;
        *pcVar1 = (char)uVar4 + (char)uVar2 * -10 + '0';
        uVar4 = uVar2;
      } while (0x12 < (ushort)(sVar3 + 9U));
    }
  }
  return;
}

Assistant:

static void conv(T v,char *&begin,char *&buf)
				{
					if(v<0) {
						*buf++ = '-';
						begin=buf;
						while(v!=0) {
							*buf++ = '0' - (v % 10);
							v/=10;
						}
					}
					else {
						decimal_traits<false>::conv(v,begin,buf);
					}
				}